

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cc
# Opt level: O2

PassDef * verona::reference(void)

{
  long lVar1;
  PassDef *in_RDI;
  allocator<char> local_1b21;
  PassDef *local_1b20;
  Token local_1b18;
  Token local_1b10;
  Token local_1b08;
  Token local_1b00;
  Token local_1af8;
  Token local_1af0;
  Token local_1ae8;
  Token local_1ae0;
  Token local_1ad8;
  Token local_1ad0;
  Token local_1ac8;
  Token local_1ac0;
  Token local_1ab8;
  Token local_1ab0;
  Token local_1aa8;
  Token local_1aa0;
  Token local_1a98;
  Token local_1a90;
  Token local_1a88;
  Token local_1a80;
  Token local_1a78;
  Token local_1a70;
  Token local_1a68;
  Token local_1a60;
  Token local_1a58;
  Token local_1a50;
  Token local_1a48;
  Token local_1a40;
  Token local_1a38;
  Token local_1a30;
  string local_1a28;
  initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  local_1a08;
  Pattern local_19f8;
  Pattern local_1980;
  Pattern local_1908;
  Pattern local_1890;
  Pattern local_1818;
  Pattern local_17a0;
  Pattern local_1728;
  Pattern local_16b0;
  Pattern local_1638;
  Pattern local_15c0;
  Pattern local_1548;
  Pattern local_14d0;
  Pattern local_1458;
  Pattern local_13e0;
  Pattern local_1368;
  Pattern local_12f0;
  Pattern local_1278;
  Pattern local_1200;
  Pattern local_1188;
  Pattern local_1110;
  Pattern local_1098;
  Pattern local_1020;
  Pattern local_fa8;
  Pattern local_f30;
  Pattern local_eb8;
  Pattern local_e40;
  Pattern local_dc8;
  Pattern local_d50;
  Pattern local_cd8;
  Pattern local_c60;
  Pattern local_be8;
  Pattern local_b70;
  Pattern local_af8;
  Pattern local_a80;
  Pattern local_a08;
  Pattern local_990;
  Pattern local_918;
  Pattern local_8a0;
  Pattern local_828;
  Pattern local_7b0;
  Pattern local_738;
  Pattern local_6c0;
  Pattern local_648;
  Located<trieste::detail::Pattern> local_5d0;
  Located<trieste::detail::Pattern> local_550;
  Located<trieste::detail::Pattern> local_4d0;
  Located<trieste::detail::Pattern> local_450;
  Located<trieste::detail::Pattern> local_3d0;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  local_350;
  Located<trieste::detail::Pattern> local_2b0;
  undefined8 local_230;
  undefined8 uStack_228;
  code *local_220;
  code *local_218;
  Located<trieste::detail::Pattern> local_210;
  undefined8 local_190;
  undefined8 uStack_188;
  code *local_180;
  code *local_178;
  Located<trieste::detail::Pattern> local_170;
  undefined8 local_f0;
  undefined8 uStack_e8;
  code *local_e0;
  code *local_d8;
  Located<trieste::detail::Pattern> local_d0;
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40;
  code *local_38;
  
  local_1b20 = in_RDI;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a28,"reference",&local_1b21);
  local_1a30.def = (TokenDef *)Expr;
  trieste::In<>(&local_7b0,&local_1a30);
  local_1a38.def = (TokenDef *)LLVM;
  trieste::T(&local_8a0,&local_1a38);
  local_1a40.def = (TokenDef *)LLVM;
  trieste::detail::Pattern::operator[](&local_828,&local_8a0,&local_1a40);
  trieste::detail::Pattern::operator*(&local_738,&local_7b0,&local_828);
  local_1a48.def = (TokenDef *)Ident;
  trieste::T(&local_990,&local_1a48);
  local_1a50.def = (TokenDef *)Lhs;
  trieste::detail::Pattern::operator[](&local_918,&local_990,&local_1a50);
  trieste::detail::Pattern::operator*(&local_6c0,&local_738,&local_918);
  local_1a58.def = (TokenDef *)Ident;
  trieste::T(&local_af8,&local_1a58);
  trieste::detail::Pattern::operator++(&local_a80,&local_af8,0);
  local_1a60.def = (TokenDef *)Rhs;
  trieste::detail::Pattern::operator[](&local_a08,&local_a80,&local_1a60);
  trieste::detail::Pattern::operator*(&local_648,&local_6c0,&local_a08);
  trieste::detail::Pattern::Pattern(&local_3d0.value,&local_648);
  local_3d0.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026f078;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_350.first,&local_3d0);
  local_350.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_350.second.super__Function_base._M_functor._8_8_ = 0;
  local_350.second._M_invoker =
       ::std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:18:11)>
       ::_M_invoke;
  local_350.second.super__Function_base._M_manager =
       ::std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:18:11)>
       ::_M_manager;
  local_1a68.def = (TokenDef *)Expr;
  trieste::In<>(&local_c60,&local_1a68);
  local_1a70.def = (TokenDef *)LLVM;
  trieste::T(&local_d50,&local_1a70);
  local_1a78.def = (TokenDef *)Lhs;
  trieste::detail::Pattern::operator[](&local_cd8,&local_d50,&local_1a78);
  trieste::detail::Pattern::operator*(&local_be8,&local_c60,&local_cd8);
  local_1a80.def = (TokenDef *)LLVM;
  trieste::T(&local_e40,&local_1a80);
  local_1a88.def = (TokenDef *)Rhs;
  trieste::detail::Pattern::operator[](&local_dc8,&local_e40,&local_1a88);
  trieste::detail::Pattern::operator*(&local_b70,&local_be8,&local_dc8);
  trieste::detail::Pattern::Pattern(&local_450.value,&local_b70);
  local_450.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026f090;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_2b0,&local_450);
  local_230 = 0;
  uStack_228 = 0;
  local_218 = ::std::
              _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:32:11)>
              ::_M_invoke;
  local_220 = ::std::
              _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:32:11)>
              ::_M_manager;
  local_1a90.def = (TokenDef *)Expr;
  trieste::In<>(&local_1020,&local_1a90);
  local_1a98.def = (TokenDef *)Dot;
  local_1aa0.def = (TokenDef *)DoubleColon;
  trieste::T<>(&local_1110,&local_1a98,&local_1aa0);
  local_1aa8.def = (TokenDef *)Dot;
  trieste::detail::Pattern::operator[](&local_1098,&local_1110,&local_1aa8);
  trieste::detail::Pattern::operator*(&local_fa8,&local_1020,&local_1098);
  local_1ab0.def = (TokenDef *)Ident;
  local_1ab8.def = (TokenDef *)Symbol;
  trieste::T<>(&local_1200,&local_1ab0,&local_1ab8);
  local_1ac0.def = (TokenDef *)Ident;
  trieste::detail::Pattern::operator[](&local_1188,&local_1200,&local_1ac0);
  trieste::detail::Pattern::operator*(&local_f30,&local_fa8,&local_1188);
  local_1ac8.def = (TokenDef *)TypeArgs;
  trieste::T(&local_1368,&local_1ac8);
  local_1ad0.def = (TokenDef *)TypeArgs;
  trieste::detail::Pattern::operator[](&local_12f0,&local_1368,&local_1ad0);
  trieste::detail::Pattern::operator~(&local_1278,&local_12f0);
  trieste::detail::Pattern::operator*(&local_eb8,&local_f30,&local_1278);
  trieste::detail::Pattern::Pattern(&local_4d0.value,&local_eb8);
  local_4d0.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026f0a8;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_210,&local_4d0);
  local_190 = 0;
  uStack_188 = 0;
  local_178 = ::std::
              _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:44:11)>
              ::_M_invoke;
  local_180 = ::std::
              _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:44:11)>
              ::_M_manager;
  local_1ad8.def = (TokenDef *)Expr;
  trieste::In<>(&local_1458,&local_1ad8);
  local_1ae0.def = (TokenDef *)Ident;
  trieste::T(&local_1548,&local_1ae0);
  local_1ae8.def = (TokenDef *)Ident;
  trieste::detail::Pattern::operator[](&local_14d0,&local_1548,&local_1ae8);
  trieste::detail::Pattern::operator*(&local_13e0,&local_1458,&local_14d0);
  trieste::detail::Pattern::Pattern(&local_550.value,&local_13e0);
  local_550.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026f0c0;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_170,&local_550);
  local_f0 = 0;
  uStack_e8 = 0;
  local_d8 = ::std::
             _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:49:40)>
             ::_M_invoke;
  local_e0 = ::std::
             _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:49:40)>
             ::_M_manager;
  local_1af0.def = (TokenDef *)Expr;
  trieste::In<>(&local_1728,&local_1af0);
  local_1af8.def = (TokenDef *)Try;
  trieste::T(&local_1818,&local_1af8);
  local_1b00.def = (TokenDef *)Try;
  trieste::detail::Pattern::operator[](&local_17a0,&local_1818,&local_1b00);
  trieste::detail::Pattern::operator*(&local_16b0,&local_1728,&local_17a0);
  local_1b08.def = (TokenDef *)Lambda;
  trieste::T(&local_1908,&local_1b08);
  local_1b10.def = (TokenDef *)Lambda;
  trieste::detail::Pattern::operator[](&local_1890,&local_1908,&local_1b10);
  trieste::detail::Pattern::operator*(&local_1638,&local_16b0,&local_1890);
  local_1b18.def = (TokenDef *)Dot;
  trieste::T(&local_19f8,&local_1b18);
  trieste::detail::Pattern::operator--(&local_1980,&local_19f8);
  trieste::detail::Pattern::operator*(&local_15c0,&local_1638,&local_1980);
  trieste::detail::Pattern::Pattern(&local_5d0.value,&local_15c0);
  local_5d0.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026f0d8;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_d0,&local_5d0);
  local_1a08._M_array = &local_350;
  local_50 = 0;
  uStack_48 = 0;
  local_38 = ::std::
             _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:62:11)>
             ::_M_invoke;
  local_40 = ::std::
             _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/reference.cc:62:11)>
             ::_M_manager;
  local_1a08._M_len = 5;
  trieste::PassDef::PassDef(local_1b20,&local_1a28,(Wellformed *)wfPassReference,2,&local_1a08);
  lVar1 = 0x280;
  do {
    ::std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)((long)&local_350.first.value.pattern.
                       super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0xa0;
  } while (lVar1 != -0xa0);
  trieste::detail::Pattern::~Pattern(&local_5d0.value);
  trieste::detail::Pattern::~Pattern(&local_15c0);
  trieste::detail::Pattern::~Pattern(&local_1980);
  trieste::detail::Pattern::~Pattern(&local_19f8);
  trieste::detail::Pattern::~Pattern(&local_1638);
  trieste::detail::Pattern::~Pattern(&local_1890);
  trieste::detail::Pattern::~Pattern(&local_1908);
  trieste::detail::Pattern::~Pattern(&local_16b0);
  trieste::detail::Pattern::~Pattern(&local_17a0);
  trieste::detail::Pattern::~Pattern(&local_1818);
  trieste::detail::Pattern::~Pattern(&local_1728);
  trieste::detail::Pattern::~Pattern(&local_550.value);
  trieste::detail::Pattern::~Pattern(&local_13e0);
  trieste::detail::Pattern::~Pattern(&local_14d0);
  trieste::detail::Pattern::~Pattern(&local_1548);
  trieste::detail::Pattern::~Pattern(&local_1458);
  trieste::detail::Pattern::~Pattern(&local_4d0.value);
  trieste::detail::Pattern::~Pattern(&local_eb8);
  trieste::detail::Pattern::~Pattern(&local_1278);
  trieste::detail::Pattern::~Pattern(&local_12f0);
  trieste::detail::Pattern::~Pattern(&local_1368);
  trieste::detail::Pattern::~Pattern(&local_f30);
  trieste::detail::Pattern::~Pattern(&local_1188);
  trieste::detail::Pattern::~Pattern(&local_1200);
  trieste::detail::Pattern::~Pattern(&local_fa8);
  trieste::detail::Pattern::~Pattern(&local_1098);
  trieste::detail::Pattern::~Pattern(&local_1110);
  trieste::detail::Pattern::~Pattern(&local_1020);
  trieste::detail::Pattern::~Pattern(&local_450.value);
  trieste::detail::Pattern::~Pattern(&local_b70);
  trieste::detail::Pattern::~Pattern(&local_dc8);
  trieste::detail::Pattern::~Pattern(&local_e40);
  trieste::detail::Pattern::~Pattern(&local_be8);
  trieste::detail::Pattern::~Pattern(&local_cd8);
  trieste::detail::Pattern::~Pattern(&local_d50);
  trieste::detail::Pattern::~Pattern(&local_c60);
  trieste::detail::Pattern::~Pattern(&local_3d0.value);
  trieste::detail::Pattern::~Pattern(&local_648);
  trieste::detail::Pattern::~Pattern(&local_a08);
  trieste::detail::Pattern::~Pattern(&local_a80);
  trieste::detail::Pattern::~Pattern(&local_af8);
  trieste::detail::Pattern::~Pattern(&local_6c0);
  trieste::detail::Pattern::~Pattern(&local_918);
  trieste::detail::Pattern::~Pattern(&local_990);
  trieste::detail::Pattern::~Pattern(&local_738);
  trieste::detail::Pattern::~Pattern(&local_828);
  trieste::detail::Pattern::~Pattern(&local_8a0);
  trieste::detail::Pattern::~Pattern(&local_7b0);
  ::std::__cxx11::string::~string((string *)&local_1a28);
  return local_1b20;
}

Assistant:

PassDef reference()
  {
    return {
      "reference",
      wfPassReference,
      dir::topdown,
      {
        // LLVM literal.
        In(Expr) * T(LLVM)[LLVM] * T(Ident)[Lhs] * T(Ident)++[Rhs] >>
          [](Match& _) {
            auto rhs = _[Rhs];
            auto s = std::string()
                       .append(_(LLVM)->location().view())
                       .append(" %")
                       .append(_(Lhs)->location().view());

            for (auto& i = rhs.first; i != rhs.second; ++i)
              s.append(", %").append((*i)->location().view());

            return LLVM ^ s;
          },

        In(Expr) * T(LLVM)[Lhs] * T(LLVM)[Rhs] >>
          [](Match& _) {
            return LLVM ^
              std::string()
                .append(_(Lhs)->location().view())
                .append(" ")
                .append(_(Rhs)->location().view());
          },

        // Dot and DoubleColon notation. Use `Ident` as a selector, even if it's
        // in scope.
        In(Expr) * T(Dot, DoubleColon)[Dot] * T(Ident, Symbol)[Ident] *
            ~T(TypeArgs)[TypeArgs] >>
          [](Match& _) {
            return Seq << _(Dot) << selector(_(Ident), _(TypeArgs));
          },

        // Local reference.
        In(Expr) * T(Ident)[Ident] >> ([](Match& _) -> Node {
          auto id = _(Ident);

          if (lookup_type(id, {Var}))
            return RefVar << id;
          else if (lookup_type(id, {Let, Param}))
            return RefLet << id;

          return NoChange;
        }),

        // Given `try { ... }`, apply the lambda.
        In(Expr) * T(Try)[Try] * T(Lambda)[Lambda] * --T(Dot) >>
          [](Match& _) {
            return Seq << Try << _(Lambda) << Dot << selector(l_apply);
          },
      }};
  }